

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

bool __thiscall Matrix::CopyColumn(Matrix *this,int source_column,int destination_column)

{
  long lVar1;
  bool bVar2;
  int row;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  bVar5 = false;
  if ((source_column != destination_column) && (0 < this->n_)) {
    lVar4 = 0;
    lVar3 = 0;
    bVar5 = false;
    do {
      lVar1 = *(long *)((long)&(((this->elements_).
                                 super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<Fraction,_std::allocator<Fraction>_>)._M_impl.
                               super__Vector_impl_data + lVar4);
      bVar2 = operator!=((Fraction *)(lVar1 + (long)destination_column * 8),
                         (Fraction *)(lVar1 + (long)source_column * 8));
      if (bVar2) {
        lVar1 = *(long *)((long)&(((this->elements_).
                                   super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<Fraction,_std::allocator<Fraction>_>)._M_impl.
                                 super__Vector_impl_data + lVar4);
        *(undefined8 *)(lVar1 + (long)destination_column * 8) =
             *(undefined8 *)(lVar1 + (long)source_column * 8);
        bVar5 = true;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x18;
    } while (lVar3 < this->n_);
  }
  return bVar5;
}

Assistant:

bool Matrix::CopyColumn(int source_column, int destination_column) {
  if (source_column == destination_column) {
    return false;
  }

  bool result = false;
  for (int row = 0; row < n_; ++row) {
    if (elements_[row][destination_column] != elements_[row][source_column]) {
      result = true;
      elements_[row][destination_column] = elements_[row][source_column];
    }
  }

  return result;
}